

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChISO2631_5_Wz::Filter
          (ChISO2631_5_Wz *this,vector<double,_std::allocator<double>_> *u,
          vector<double,_std::allocator<double>_> *y)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  const_iterator __first;
  ulong *puVar4;
  Scalar *pSVar5;
  pointer pdVar6;
  long lVar7;
  ulong *puVar8;
  size_type __new_size;
  int k;
  int t;
  ulong uVar9;
  int j;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int asz_size;
  long local_78;
  long local_70;
  vector<double,_std::allocator<double>_> asz;
  ChMatrixDynamic<> x;
  int local_34;
  
  std::vector<double,_std::allocator<double>_>::vector(&asz,8,(allocator_type *)&x);
  std::vector<double,std::allocator<double>>::
  insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&asz,
             (const_iterator)
             asz.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  __new_size = (long)asz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)asz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
  asz_size = (int)__new_size;
  std::vector<double,_std::allocator<double>_>::resize(y,__new_size,(value_type_conflict1 *)&x);
  local_34 = 7;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&x,&asz_size,&local_34);
  local_70 = 0x38;
  local_78 = 0;
  for (uVar9 = 9;
      uVar9 <= (ulong)((long)asz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)asz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    puVar8 = &m_w;
    for (lVar10 = 1;
        pdVar6 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start, lVar10 != 8; lVar10 = lVar10 + 1) {
      auVar12 = ZEXT816(0);
      lVar7 = 7;
      puVar4 = puVar8;
      while (lVar7 != 3) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)((long)pdVar6 + lVar7 * 8 + local_78);
        lVar7 = lVar7 + -1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *puVar4;
        auVar12 = vfmadd231sd_fma(auVar12,auVar14,auVar2);
        puVar4 = puVar4 + 7;
      }
      auVar13 = ZEXT816(0) << 0x40;
      puVar4 = (ulong *)((long)asz.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + local_70);
      for (lVar7 = 0x1c; lVar7 != 0x54; lVar7 = lVar7 + 7) {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *puVar4;
        puVar4 = puVar4 + -1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = puVar8[lVar7];
        auVar13 = vfmadd231sd_fma(auVar13,auVar16,auVar3);
      }
      dVar11 = tanh(auVar12._0_8_ + auVar13._0_8_ + *(double *)(&UNK_00f633b8 + lVar10 * 8));
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&x,
                          uVar9 - 1,lVar10 + -1);
      puVar8 = puVar8 + 1;
      *pSVar5 = dVar11;
    }
    pdVar6[uVar9 - 1] = 0.0;
    auVar12 = ZEXT816(0);
    lVar7 = 0;
    lVar10 = 1;
    while (lVar7 != 7) {
      uVar1 = (&m_W)[lVar7];
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&x,
                          uVar9 - 1,lVar10 + -1);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *pSVar5;
      pdVar6 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar1;
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = pdVar6[uVar9 - 1];
      auVar12 = vfmadd213sd_fma(auVar13,auVar15,auVar12);
      pdVar6[uVar9 - 1] = auVar12._0_8_;
    }
    local_78 = local_78 + 8;
    local_70 = local_70 + 8;
    pdVar6[uVar9 - 1] = auVar12._0_8_ + 21.51959;
  }
  __first._M_current =
       (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<double,_std::allocator<double>_>::erase
            (y,__first,(const_iterator)(__first._M_current + 8));
  Eigen::internal::handmade_aligned_free
            (x.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&asz.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void ChISO2631_5_Wz::Filter(std::vector<double>& u, std::vector<double>& y) {
    std::vector<double> asz(8);
    asz.insert(asz.end(), u.begin(), u.end());
    int asz_size = static_cast<int>(asz.size());
    y.resize(asz.size(), 0.0);
    ChMatrixDynamic<> x(asz_size, 7);
    // indices run from 1 to N to make it compatible to Matlab
    for (int t = 9; t <= asz.size(); t++) {
        for (int j = 1; j <= 7; j++) {
            double S1 = 0.0;
            for (int k = 1; k <= 4; k++) {
                S1 += y[t - k - 1] * m_w[k - 1][j - 1];
            }
            double S2 = 0.0;
            int kk = 1;
            for (int k = 5; k <= 12; k++) {
                S2 += asz[t - kk - 1] * m_w[k - 1][j - 1];
                kk++;
            }
            x(t - 1, j - 1) = tanh(S1 + S2 + m_w[12][j - 1]);
        }
        y[t - 1] = 0.0;
        for (int k = 1; k <= 7; k++) {
            y[t - 1] += m_W[k - 1] * x(t - 1, k - 1);
        }
        y[t - 1] += m_W[7];
    }
    y.erase(y.begin(), y.begin() + 8);  // get rid of leading zeros
}